

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O0

int __thiscall
JetHead::CircularBuffer::write_internal(CircularBuffer *this,uint8_t *buffer,int size)

{
  int iVar1;
  int local_28;
  int head_size;
  int tail_size;
  int size_local;
  uint8_t *buffer_local;
  CircularBuffer *this_local;
  
  if (buffer == (uint8_t *)0x0) {
    this_local._4_4_ = 0;
  }
  else {
    iVar1 = getFreeSpace(this);
    head_size = size;
    if (iVar1 < size) {
      head_size = getFreeSpace(this);
    }
    if (head_size == 0) {
      this_local._4_4_ = 0;
    }
    else {
      local_28 = (int)this->mEnd - (int)this->mWritePtr;
      if (head_size < local_28) {
        local_28 = head_size;
      }
      bufferCopy(this,this->mWritePtr,buffer,local_28);
      this->mWritePtr = this->mWritePtr + local_28;
      if (this->mWritePtr == this->mEnd) {
        this->mWritePtr = this->mBuffer;
      }
      if (local_28 < head_size) {
        if (buffer != (uint8_t *)0x0) {
          bufferCopy(this,this->mWritePtr,buffer + local_28,head_size - local_28);
        }
        this->mWritePtr = this->mWritePtr + (head_size - local_28);
      }
      add_length_internal(this,head_size);
      Condition::Broadcast(&this->mDataCondition);
      this_local._4_4_ = head_size;
    }
  }
  return this_local._4_4_;
}

Assistant:

int CircularBuffer::write_internal( const uint8_t *buffer, int size )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	if ( buffer == NULL )
		return 0;
	
	// limit size to free space, we will return this for the size of
	// this write
	if ( size > getFreeSpace() )
		size = getFreeSpace();

	// if size is zero, return early
	if ( size == 0 )
		return 0;
	
	// first, copy from the write pointer up to the end of the buffer,
	// note that this truncates implicitly to no more than free space
	int tail_size = mEnd - mWritePtr;

	// truncate tail_size to the requested write size, note that size
	// has already been truncated to no more than free space
	if ( tail_size > size )
		tail_size = size;

	bufferCopy( mWritePtr, buffer, tail_size );
	mWritePtr += tail_size;

	// if the write pointer is now at the end of the buffer, then
	// reset it to the beginning of the buffer
	if ( mWritePtr == mEnd )
		mWritePtr = mBuffer;

	// if tail_size is less than size, then we haven't filled free
	// space up to the write request size, so continue at the begining
	// of the buffer
	if ( tail_size < size )
	{
		// compute the remainder of the size bytes to write, which we
		// have already truncated to available free space
		int head_size = size - tail_size;
		
		// copy head_size bytes into the begining of the circular
		// buffer from offset tail_size within our input buffer
		if (buffer != NULL)
		{
			bufferCopy( mWritePtr, buffer + tail_size, head_size );
		}
		mWritePtr += head_size;
	}
	
	// update the space now in use in the buffer
	add_length_internal( size );
	
	// signal all waiters for data.
	mDataCondition.Broadcast();

	LOG( "wp %p rd %p", mWritePtr, mReadPtr );

	return size;
}